

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void list_client_accounts(int client_id)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long local_238;
  ifstream inFile;
  undefined1 local_30 [8];
  Account account;
  int client_id_local;
  
  account._28_4_ = client_id;
  Account::Account((Account *)local_30);
  std::ifstream::ifstream(&local_238);
  std::ifstream::open((char *)&local_238,0x107145);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"\n\n\t\tACCOUNT HOLDER LIST\n\n");
    std::operator<<((ostream *)&std::cout,
                    "Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n"
                   );
    while( true ) {
      plVar4 = (long *)std::istream::read((char *)&local_238,(long)local_30);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar2) break;
      iVar3 = Account::get_client_id((Account *)local_30);
      if (iVar3 == account._28_4_) {
        Account::account_data_in_tabular_format((Account *)local_30);
      }
    }
    std::ifstream::close();
  }
  else {
    std::operator<<((ostream *)&std::cout,"File could not be open !! Press any Key...");
  }
  std::ifstream::~ifstream(&local_238);
  return;
}

Assistant:

void list_client_accounts(int client_id)
{
    /*!
     * It is a helper function that helps to show the list of accounts
     * that's owned by the client and created in the banking system.
     * To do that it reads data from Account.dat and it uses
     * Account.get_client_id & Account::account_data_in_tabular_format
     * to accomplish its task
     */
    Account account;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\n\n\t\tACCOUNT HOLDER LIST\n\n";

    std::cout<<"Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n";

    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if (account.get_client_id() == client_id){
            account.account_data_in_tabular_format();
        }

    }
    inFile.close();
}